

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlValidGetPotentialChildren(void)

{
  int iVar1;
  int iVar2;
  int val;
  xmlChar **val_00;
  int *val_01;
  uint local_4c;
  int n_max;
  int max;
  int n_len;
  int *len;
  int n_names;
  xmlChar **names;
  int n_ctree;
  xmlElementContent *ctree;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (names._4_4_ = 0; (int)names._4_4_ < 1; names._4_4_ = names._4_4_ + 1) {
    for (len._4_4_ = 0; (int)len._4_4_ < 1; len._4_4_ = len._4_4_ + 1) {
      for (n_max = 0; n_max < 2; n_max = n_max + 1) {
        for (local_4c = 0; (int)local_4c < 4; local_4c = local_4c + 1) {
          iVar1 = xmlMemBlocks();
          val_00 = gen_const_xmlChar_ptr_ptr(len._4_4_,1);
          val_01 = gen_int_ptr(n_max,2);
          iVar2 = gen_int(local_4c,3);
          val = xmlValidGetPotentialChildren(0,val_00,val_01,iVar2);
          desret_int(val);
          call_tests = call_tests + 1;
          des_const_xmlChar_ptr_ptr(len._4_4_,val_00,1);
          des_int_ptr(n_max,val_01,2);
          des_int(local_4c,iVar2,3);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlValidGetPotentialChildren",
                   (ulong)(uint)(iVar2 - iVar1));
            ret_val = ret_val + 1;
            printf(" %d",(ulong)names._4_4_);
            printf(" %d",(ulong)len._4_4_);
            printf(" %d",(ulong)(uint)n_max);
            printf(" %d",(ulong)local_4c);
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlValidGetPotentialChildren(void) {
    int test_ret = 0;

#if defined(LIBXML_VALID_ENABLED)
#ifdef LIBXML_VALID_ENABLED
    int mem_base;
    int ret_val;
    xmlElementContent * ctree; /* an element content tree */
    int n_ctree;
    xmlChar ** names; /* an array to store the list of child names */
    int n_names;
    int * len; /* a pointer to the number of element in the list */
    int n_len;
    int max; /* the size of the array */
    int n_max;

    for (n_ctree = 0;n_ctree < gen_nb_xmlElementContent_ptr;n_ctree++) {
    for (n_names = 0;n_names < gen_nb_const_xmlChar_ptr_ptr;n_names++) {
    for (n_len = 0;n_len < gen_nb_int_ptr;n_len++) {
    for (n_max = 0;n_max < gen_nb_int;n_max++) {
        mem_base = xmlMemBlocks();
        ctree = gen_xmlElementContent_ptr(n_ctree, 0);
        names = gen_const_xmlChar_ptr_ptr(n_names, 1);
        len = gen_int_ptr(n_len, 2);
        max = gen_int(n_max, 3);

        ret_val = xmlValidGetPotentialChildren(ctree, (const xmlChar **)names, len, max);
        desret_int(ret_val);
        call_tests++;
        des_xmlElementContent_ptr(n_ctree, ctree, 0);
        des_const_xmlChar_ptr_ptr(n_names, (const xmlChar **)names, 1);
        des_int_ptr(n_len, len, 2);
        des_int(n_max, max, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlValidGetPotentialChildren",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctree);
            printf(" %d", n_names);
            printf(" %d", n_len);
            printf(" %d", n_max);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;
#endif
#endif

    return(test_ret);
}